

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O0

void llvm::object_deleter<llvm::cl::SubCommand>::call(void *Ptr)

{
  void *Ptr_local;
  
  if (Ptr != (void *)0x0) {
    cl::SubCommand::~SubCommand((SubCommand *)Ptr);
    operator_delete(Ptr,0xa8);
  }
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }